

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

SyntaxKind slang::syntax::SyntaxFacts::getBinaryPropertyExpr(TokenKind kind)

{
  TokenKind kind_local;
  undefined4 local_4;
  
  if (kind == HashMinusHash) {
    local_4 = FollowedByPropertyExpr;
  }
  else if (kind == HashEqualsHash) {
    local_4 = FollowedByPropertyExpr;
  }
  else if (kind == OrMinusArrow) {
    local_4 = ImplicationPropertyExpr;
  }
  else if (kind == OrEqualsArrow) {
    local_4 = ImplicationPropertyExpr;
  }
  else if (kind == AndKeyword) {
    local_4 = AndPropertyExpr;
  }
  else if (kind == IffKeyword) {
    local_4 = IffPropertyExpr;
  }
  else if (kind == ImpliesKeyword) {
    local_4 = ImpliesPropertyExpr;
  }
  else if (kind == OrKeyword) {
    local_4 = OrPropertyExpr;
  }
  else if (kind == SUntilKeyword) {
    local_4 = SUntilPropertyExpr;
  }
  else if (kind == SUntilWithKeyword) {
    local_4 = SUntilWithPropertyExpr;
  }
  else if (kind == UntilKeyword) {
    local_4 = UntilPropertyExpr;
  }
  else if (kind == UntilWithKeyword) {
    local_4 = UntilWithPropertyExpr;
  }
  else {
    local_4 = Unknown;
  }
  return local_4;
}

Assistant:

SyntaxKind SyntaxFacts::getBinaryPropertyExpr(TokenKind kind) {
    switch (kind) {
        case TokenKind::AndKeyword: return SyntaxKind::AndPropertyExpr;
        case TokenKind::OrKeyword: return SyntaxKind::OrPropertyExpr;
        case TokenKind::IffKeyword: return SyntaxKind::IffPropertyExpr;
        case TokenKind::UntilKeyword: return SyntaxKind::UntilPropertyExpr;
        case TokenKind::SUntilKeyword: return SyntaxKind::SUntilPropertyExpr;
        case TokenKind::UntilWithKeyword: return SyntaxKind::UntilWithPropertyExpr;
        case TokenKind::SUntilWithKeyword: return SyntaxKind::SUntilWithPropertyExpr;
        case TokenKind::ImpliesKeyword: return SyntaxKind::ImpliesPropertyExpr;
        case TokenKind::OrMinusArrow: return SyntaxKind::ImplicationPropertyExpr;
        case TokenKind::OrEqualsArrow: return SyntaxKind::ImplicationPropertyExpr;
        case TokenKind::HashMinusHash: return SyntaxKind::FollowedByPropertyExpr;
        case TokenKind::HashEqualsHash: return SyntaxKind::FollowedByPropertyExpr;
        default: return SyntaxKind::Unknown;
    }
}